

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

int match(c2m_ctx_t c2m_ctx,int c,pos_t *pos,node_code_t *node_code,node_t_conflict *node)

{
  parse_ctx *ppVar1;
  token_t ptVar2;
  int iVar3;
  parse_ctx_t parse_ctx;
  node_t_conflict *node_local;
  node_code_t *node_code_local;
  pos_t *pos_local;
  int c_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->parse_ctx;
  if ((short)*(undefined4 *)ppVar1->curr_token == c) {
    if (pos != (pos_t *)0x0) {
      ptVar2 = ppVar1->curr_token;
      pos->fname = (ptVar2->pos).fname;
      iVar3 = (ptVar2->pos).ln_pos;
      pos->lno = (ptVar2->pos).lno;
      pos->ln_pos = iVar3;
    }
    if (node_code != (node_code_t *)0x0) {
      *node_code = ppVar1->curr_token->node_code;
    }
    if (node != (node_t_conflict *)0x0) {
      *node = ppVar1->curr_token->node;
    }
    read_token(c2m_ctx);
    c2m_ctx_local._4_4_ = 1;
  }
  else {
    c2m_ctx_local._4_4_ = 0;
  }
  return c2m_ctx_local._4_4_;
}

Assistant:

static int match (c2m_ctx_t c2m_ctx, int c, pos_t *pos, node_code_t *node_code, node_t *node) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;

  if (curr_token->code != c) return FALSE;
  if (pos != NULL) *pos = curr_token->pos;
  if (node_code != NULL) *node_code = curr_token->node_code;
  if (node != NULL) *node = curr_token->node;
  read_token (c2m_ctx);
  return TRUE;
}